

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall
FormatterTest_FormatSCharString_Test::TestBody(FormatterTest_FormatSCharString_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  AssertionResult gtest_ar;
  char str [5];
  internal local_280 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined4 local_250;
  undefined1 local_24c;
  undefined4 *local_248 [2];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  undefined1 *local_230;
  long lStack_228;
  undefined8 local_220;
  undefined1 local_218 [504];
  
  local_24c = 0;
  local_250 = 0x74736574;
  lStack_228 = 0;
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_220 = 500;
  format_str.size_ = 5;
  format_str.data_ = "{0:s}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_248;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,signed_char[5]>
                ::TYPES;
  local_248[0] = &local_250;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str,args,(locale_ref)0x0);
  paVar1 = &local_270.field_2;
  local_270._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_270,local_230,local_230 + lStack_228);
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            (local_280,"\"test\"","format(\"{0:s}\", str)",(char (*) [5])0x250ec9,&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if (local_280[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_278.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_278.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x613,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_270,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_270);
    if (local_238.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_238.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_238.ptr_ + 8))();
      }
      local_238.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_278,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lStack_228 = 0;
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_220 = 500;
  format_str_00.size_ = 5;
  format_str_00.data_ = "{0:s}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_248;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,signed_char_const*>
       ::TYPES;
  local_248[0] = &local_250;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str_00,args_00,(locale_ref)0x0);
  local_270._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_270,local_230,local_230 + lStack_228);
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            (local_280,"\"test\"","format(\"{0:s}\", const_str)",(char (*) [5])0x250ec9,&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if (local_280[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_278.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_278.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x615,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_270,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_270);
    if (local_238.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_238.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_238.ptr_ + 8))();
      }
      local_238.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_278,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatterTest, FormatSCharString) {
  signed char str[] = "test";
  EXPECT_EQ("test", format("{0:s}", str));
  const signed char *const_str = str;
  EXPECT_EQ("test", format("{0:s}", const_str));
}